

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O3

void Ivy_ManHaigPostprocess(Ivy_Man_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  char *__s;
  int nChoices;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  if (p->pHaig == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                  ,0x162,"void Ivy_ManHaigPostprocess(Ivy_Man_t *, int)");
  }
  if (fVerbose == 0) {
    iVar2 = Ivy_ManIsAcyclic(p->pHaig);
    if (iVar2 != 0) {
      return;
    }
  }
  else {
    printf("Final    : ");
    Ivy_ManPrintStats(p);
    printf("HAIG     : ");
    Ivy_ManPrintStats(p->pHaig);
    uVar1 = Ivy_ManHaigCountChoices(p,(int *)&local_14);
    printf("Total choice nodes = %d. Total choices = %d. Skipped classes = %d.\n",(ulong)uVar1,
           (ulong)local_14,(ulong)(uint)p->pHaig->nClassesSkip);
    iVar2 = Ivy_ManIsAcyclic(p->pHaig);
    if (iVar2 != 0) {
      __s = "HAIG is acyclic";
      goto LAB_0075d984;
    }
  }
  __s = "HAIG contains a cycle";
LAB_0075d984:
  puts(__s);
  return;
}

Assistant:

void Ivy_ManHaigPostprocess( Ivy_Man_t * p, int fVerbose )
{
    int nChoices, nChoiceNodes;

    assert( p->pHaig != NULL );

    if ( fVerbose )
    {
        printf( "Final    : " );
        Ivy_ManPrintStats( p );
        printf( "HAIG     : " );
        Ivy_ManPrintStats( p->pHaig );

        // print choice node stats
        nChoiceNodes = Ivy_ManHaigCountChoices( p, &nChoices );
        printf( "Total choice nodes = %d. Total choices = %d. Skipped classes = %d.\n", 
            nChoiceNodes, nChoices, p->pHaig->nClassesSkip ); 
    }

    if ( Ivy_ManIsAcyclic( p->pHaig ) )
    {
        if ( fVerbose )
            printf( "HAIG is acyclic\n" );
    }
    else
        printf( "HAIG contains a cycle\n" );

//    if ( fVerbose )
//        Ivy_ManHaigSimulate( p );
}